

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::multiply(IEEEFloat *this,IEEEFloat *rhs,roundingMode rounding_mode)

{
  opStatus oVar1;
  lostFraction lost_fraction;
  opStatus oVar2;
  
  this->field_0x12 = this->field_0x12 ^ rhs->field_0x12 & 8;
  oVar1 = multiplySpecials(this,rhs);
  if ((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) {
    lost_fraction = multiplySignificand(this,rhs,(IEEEFloat *)0x0);
    oVar2 = normalize(this,rounding_mode,lost_fraction);
    oVar1 = oVar2 | opInexact;
    if (lost_fraction == lfExactlyZero) {
      oVar1 = oVar2;
    }
  }
  return oVar1;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::multiply(const IEEEFloat &rhs,
                                        roundingMode rounding_mode) {
  opStatus fs;

  sign ^= rhs.sign;
  fs = multiplySpecials(rhs);

  if (isFiniteNonZero()) {
    lostFraction lost_fraction = multiplySignificand(rhs, nullptr);
    fs = normalize(rounding_mode, lost_fraction);
    if (lost_fraction != lfExactlyZero)
      fs = (opStatus) (fs | opInexact);
  }

  return fs;
}